

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SwapElements
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index1,
          int index2)

{
  undefined1 uVar1;
  undefined4 uVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  LogMessage *other;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"Swap","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"Swap",
               "Field is singular; the method requires a repeated field.");
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    iVar5 = this->extensions_offset_;
    if (iVar5 == -1) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      other = LogMessage::operator<<(&local_68,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_69,other);
      LogMessage::~LogMessage(&local_68);
      iVar5 = this->extensions_offset_;
    }
    ExtensionSet::SwapElements
              ((ExtensionSet *)((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar5)
               ,*(int *)(field + 0x28),index1,index2);
  }
  else {
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4))
    {
    case 1:
    case 3:
    case 8:
      lVar3 = *(long *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (long)this->offsets_
                             [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30))
                                   >> 3) * -0x11111111]);
      uVar2 = *(undefined4 *)(lVar3 + (long)index1 * 4);
      *(undefined4 *)(lVar3 + (long)index1 * 4) = *(undefined4 *)(lVar3 + (long)index2 * 4);
      *(undefined4 *)(lVar3 + (long)index2 * 4) = uVar2;
      break;
    case 2:
    case 4:
    case 9:
    case 10:
      lVar3 = *(long *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (long)this->offsets_
                             [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30))
                                   >> 3) * -0x11111111]);
      uVar4 = *(undefined8 *)(lVar3 + (long)index1 * 8);
      *(undefined8 *)(lVar3 + (long)index1 * 8) = *(undefined8 *)(lVar3 + (long)index2 * 8);
      *(undefined8 *)(lVar3 + (long)index2 * 8) = uVar4;
      break;
    case 5:
      lVar3 = *(long *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (long)this->offsets_
                             [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30))
                                   >> 3) * -0x11111111]);
      uVar4 = *(undefined8 *)(lVar3 + (long)index1 * 8);
      *(undefined8 *)(lVar3 + (long)index1 * 8) = *(undefined8 *)(lVar3 + (long)index2 * 8);
      *(undefined8 *)(lVar3 + (long)index2 * 8) = uVar4;
      break;
    case 6:
      lVar3 = *(long *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (long)this->offsets_
                             [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30))
                                   >> 3) * -0x11111111]);
      uVar2 = *(undefined4 *)(lVar3 + (long)index1 * 4);
      *(undefined4 *)(lVar3 + (long)index1 * 4) = *(undefined4 *)(lVar3 + (long)index2 * 4);
      *(undefined4 *)(lVar3 + (long)index2 * 4) = uVar2;
      break;
    case 7:
      lVar3 = *(long *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (long)this->offsets_
                             [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30))
                                   >> 3) * -0x11111111]);
      uVar1 = *(undefined1 *)(lVar3 + index1);
      *(undefined1 *)(lVar3 + index1) = *(undefined1 *)(lVar3 + index2);
      *(undefined1 *)(lVar3 + index2) = uVar1;
    }
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SwapElements(
    Message* message,
    const FieldDescriptor* field,
    int index1,
    int index2) const {
  USAGE_CHECK_MESSAGE_TYPE(Swap);
  USAGE_CHECK_REPEATED(Swap);

  if (field->is_extension()) {
    MutableExtensionSet(message)->SwapElements(field->number(), index1, index2);
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        MutableRaw<RepeatedField<LOWERCASE> >(message, field)                 \
            ->SwapElements(index1, index2);                                   \
        break

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        MutableRaw<RepeatedPtrFieldBase>(message, field)
            ->SwapElements(index1, index2);
        break;
    }
  }
}